

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall GdlLookupExpression::TestsJustification(GdlLookupExpression *this)

{
  bool bVar1;
  string local_30;
  
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtProcState);
  if (bVar1) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_30,this->m_psymName);
    bVar1 = std::operator==(&local_30,"JustifyMode");
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GdlLookupExpression::TestsJustification()
{
	if (!m_psymName->FitsSymbolType(ksymtProcState))
		return false;

	if (m_psymName->FullName() == "JustifyMode")
		return true;
	//if (m_psymName->FullName() == "JustifyLevel")
	//	return true;

	return false;
}